

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O2

void __thiscall rpc_tests::rpc_namedonlyparams::test_method(rpc_namedonlyparams *this)

{
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  arg_names_00;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  arg_names_01;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  arg_names_02;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  arg_names_03;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  arg_names_04;
  long lVar1;
  RPCTestingSetup *pRVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator pvVar4;
  iterator in_R9;
  long in_FS_OFFSET;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  __l;
  const_string file;
  string_view json;
  const_string file_00;
  string_view json_00;
  const_string file_01;
  string_view json_01;
  const_string file_02;
  string_view json_02;
  const_string file_03;
  const_string file_04;
  string_view json_03;
  const_string file_05;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  undefined4 in_stack_fffffffffffffb38;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffb3c;
  undefined4 uVar6;
  undefined8 in_stack_fffffffffffffb40;
  char *pcVar7;
  pointer in_stack_fffffffffffffb48;
  char *pcVar8;
  char *local_480;
  char *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  char *local_460;
  char *local_458;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  local_450;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  char *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  local_3b8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  local_380;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  local_338;
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  local_2f0;
  char *local_2d8;
  char *local_2d0;
  undefined **local_2c8;
  undefined1 local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  allocator_type local_283;
  bool local_282;
  bool local_281;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  arg_names;
  UniValue local_248;
  UniValue local_1d0;
  UniValue local_178;
  undefined1 local_120 [32];
  undefined1 local_100 [16];
  undefined1 *local_f0;
  char *local_e8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  local_d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  local_b0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  local_88;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_178.typ._0_1_ = VNULL;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  pair<const_char_(&)[5],_bool,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
              *)local_100,(char (*) [5])"arg1",(bool *)&local_178);
  local_2c8 = (undefined **)((ulong)local_2c8 & 0xffffffffffffff00);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  pair<const_char_(&)[5],_bool,_true>(&local_d8,(char (*) [5])"arg2",(bool *)&local_2c8);
  local_120[0] = (string)0x1;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  pair<const_char_(&)[5],_bool,_true>(&local_b0,(char (*) [5])"opt1",(bool *)local_120);
  local_281 = true;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  pair<const_char_(&)[5],_bool,_true>(&local_88,(char (*) [5])"opt2",&local_281);
  local_282 = false;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  pair<const_char_(&)[8],_bool,_true>(&local_60,(char (*) [8])0xe27fe6,&local_282);
  __l._M_len = 5;
  __l._M_array = (iterator)local_100;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::vector(&arg_names,__l,&local_283);
  lVar1 = 0xa0;
  do {
    std::__cxx11::string::~string((string *)(local_100 + lVar1));
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x28);
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x77;
  file.m_begin = (iterator)&local_298;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2a8,msg);
  local_2c0 = 0;
  local_2c8 = &PTR__lazy_ostream_011480b0;
  local_2b8 = boost::unit_test::lazy_ostream::inst;
  local_2b0 = "";
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_2d0 = "";
  json._M_str = "{\"arg1\": 1, \"arg2\": 2}";
  json._M_len = 0x16;
  JSON(&local_178,json);
  pRVar2 = (RPCTestingSetup *)&arg_names;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::vector(&local_2f0,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            *)pRVar2);
  arg_names_00.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffffb3c;
  arg_names_00.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = in_stack_fffffffffffffb38;
  arg_names_00.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffb40;
  arg_names_00.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffb48;
  RPCTestingSetup::TransformParams((UniValue *)local_100,pRVar2,&local_178,arg_names_00);
  UniValue::write_abi_cxx11_((UniValue *)local_120,(int)local_100,(void *)0x0,0);
  pcVar8 = "\"[1,2]\"";
  pcVar7 = "[1,2]";
  uVar5 = 0xbd15b3;
  uVar6 = 0;
  pvVar3 = (iterator)0x2;
  pvVar4 = local_120;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[6]>
            (&local_2c8,&local_2d8,0x77,1);
  std::__cxx11::string::~string((string *)local_120);
  UniValue::~UniValue((UniValue *)local_100);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~vector(&local_2f0);
  UniValue::~UniValue(&local_178);
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_2f8 = "";
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x7a;
  file_00.m_begin = (iterator)&local_300;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_310,
             msg_00);
  local_2c0 = 0;
  local_2c8 = &PTR__lazy_ostream_011480b0;
  local_2b8 = boost::unit_test::lazy_ostream::inst;
  local_2b0 = "";
  local_320 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_318 = "";
  json_00._M_str = "{\"arg1\": 1, \"arg2\": 2, \"opt1\": 10, \"opt2\": 20}";
  json_00._M_len = 0x2e;
  JSON(&local_178,json_00);
  pRVar2 = (RPCTestingSetup *)&arg_names;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::vector(&local_338,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            *)pRVar2);
  arg_names_01.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = uVar6;
  arg_names_01.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = uVar5;
  arg_names_01.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pcVar7;
  arg_names_01.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pcVar8;
  RPCTestingSetup::TransformParams((UniValue *)local_100,pRVar2,&local_178,arg_names_01);
  UniValue::write_abi_cxx11_((UniValue *)local_120,(int)local_100,(void *)0x0,0);
  pcVar8 = "R\"([1,2,{\"opt1\":10,\"opt2\":20}])\"";
  pcVar7 = "[1,2,{\"opt1\":10,\"opt2\":20}]";
  uVar5 = 0xbd1636;
  uVar6 = 0;
  pvVar3 = (iterator)0x2;
  pvVar4 = local_120;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[28]>
            (&local_2c8,&local_320,0x7a,1);
  std::__cxx11::string::~string((string *)local_120);
  UniValue::~UniValue((UniValue *)local_100);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~vector(&local_338);
  UniValue::~UniValue(&local_178);
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_340 = "";
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x7d;
  file_01.m_begin = (iterator)&local_348;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_358,
             msg_01);
  local_2c0 = 0;
  local_2c8 = &PTR__lazy_ostream_011480b0;
  local_2b8 = boost::unit_test::lazy_ostream::inst;
  local_2b0 = "";
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_360 = "";
  json_01._M_str = "{\"arg1\": 1, \"arg2\": 2, \"options\":{\"opt1\": 10, \"opt2\": 20}}";
  json_01._M_len = 0x3a;
  JSON(&local_178,json_01);
  pRVar2 = (RPCTestingSetup *)&arg_names;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::vector(&local_380,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            *)pRVar2);
  arg_names_02.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = uVar6;
  arg_names_02.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = uVar5;
  arg_names_02.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pcVar7;
  arg_names_02.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pcVar8;
  RPCTestingSetup::TransformParams((UniValue *)local_100,pRVar2,&local_178,arg_names_02);
  UniValue::write_abi_cxx11_((UniValue *)local_120,(int)local_100,(void *)0x0,0);
  pcVar8 = "R\"([1,2,{\"opt1\":10,\"opt2\":20}])\"";
  pcVar7 = "[1,2,{\"opt1\":10,\"opt2\":20}]";
  uVar5 = 0xbd170c;
  uVar6 = 0;
  pvVar3 = (iterator)0x2;
  pvVar4 = local_120;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[28]>
            (&local_2c8,&local_368,0x7d,1);
  std::__cxx11::string::~string((string *)local_120);
  UniValue::~UniValue((UniValue *)local_100);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~vector(&local_380);
  UniValue::~UniValue(&local_178);
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_388 = "";
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x81;
  file_02.m_begin = (iterator)&local_390;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_3a0,
             msg_02);
  json_02._M_str = "{\"arg1\": 1, \"arg2\": 2, \"opt1\": 10, \"options\":{\"opt1\": 10}}";
  json_02._M_len = 0x3a;
  JSON((UniValue *)local_100,json_02);
  pRVar2 = (RPCTestingSetup *)&arg_names;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::vector(&local_3b8,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            *)pRVar2);
  arg_names_03.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = uVar6;
  arg_names_03.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = uVar5;
  arg_names_03.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pcVar7;
  arg_names_03.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pcVar8;
  RPCTestingSetup::TransformParams(&local_1d0,pRVar2,(UniValue *)local_100,arg_names_03);
  UniValue::~UniValue(&local_1d0);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~vector(&local_3b8);
  UniValue::~UniValue((UniValue *)local_100);
  local_3c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_3c0 = "";
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x81;
  file_03.m_begin = (iterator)&local_3c8;
  msg_03.m_end = pvVar4;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_3d8,
             msg_03);
  local_178.typ._0_1_ = VNULL;
  local_178.val._M_dataplus._M_p = (pointer)0x0;
  local_178.val._M_string_length = 0;
  local_100[8] = false;
  local_100._0_8_ = &PTR__lazy_ostream_01149210;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "exception UniValue expected but not raised";
  local_3e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_3e0 = "";
  uVar5 = 0;
  uVar6 = 0;
  pvVar4 = &DAT_00000001;
  pvVar3 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_178,(lazy_ostream *)local_100,1,1,WARN,(check_type)pcVar7,
             (size_t)&local_3e8,0x81);
  boost::detail::shared_count::~shared_count((shared_count *)&local_178.val._M_string_length);
  local_428 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_420 = "";
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x85;
  file_04.m_begin = (iterator)&local_428;
  msg_04.m_end = pvVar3;
  msg_04.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_438,
             msg_04);
  json_03._M_str = "{\"args\": [1, 2, {\"opt1\": 10}], \"opt2\": 20}";
  json_03._M_len = 0x2a;
  JSON((UniValue *)local_100,json_03);
  pRVar2 = (RPCTestingSetup *)&arg_names;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::vector(&local_450,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            *)pRVar2);
  arg_names_04.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = uVar6;
  arg_names_04.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = uVar5;
  arg_names_04.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pcVar7;
  arg_names_04.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pcVar8;
  RPCTestingSetup::TransformParams(&local_248,pRVar2,(UniValue *)local_100,arg_names_04);
  UniValue::~UniValue(&local_248);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~vector(&local_450);
  UniValue::~UniValue((UniValue *)local_100);
  local_460 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_458 = "";
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x85;
  file_05.m_begin = (iterator)&local_460;
  msg_05.m_end = pvVar3;
  msg_05.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_470,
             msg_05);
  local_178.typ._0_1_ = VNULL;
  local_178.val._M_dataplus._M_p = (pointer)0x0;
  local_178.val._M_string_length = 0;
  local_100[8] = false;
  local_100._0_8_ = &PTR__lazy_ostream_01149210;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "exception UniValue expected but not raised";
  local_480 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_478 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_178,(lazy_ostream *)local_100,1,1,WARN,(check_type)pcVar7,
             (size_t)&local_480,0x85);
  boost::detail::shared_count::~shared_count((shared_count *)&local_178.val._M_string_length);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~vector(&arg_names);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(rpc_namedonlyparams)
{
    const std::vector<std::pair<std::string, bool>> arg_names{{"arg1", false}, {"arg2", false}, {"opt1", true}, {"opt2", true}, {"options", false}};

    // Make sure optional parameters are really optional.
    BOOST_CHECK_EQUAL(TransformParams(JSON(R"({"arg1": 1, "arg2": 2})"), arg_names).write(), "[1,2]");

    // Make sure named-only parameters are passed as options.
    BOOST_CHECK_EQUAL(TransformParams(JSON(R"({"arg1": 1, "arg2": 2, "opt1": 10, "opt2": 20})"), arg_names).write(), R"([1,2,{"opt1":10,"opt2":20}])");

    // Make sure options can be passed directly.
    BOOST_CHECK_EQUAL(TransformParams(JSON(R"({"arg1": 1, "arg2": 2, "options":{"opt1": 10, "opt2": 20}})"), arg_names).write(), R"([1,2,{"opt1":10,"opt2":20}])");

    // Make sure options and named parameters conflict.
    BOOST_CHECK_EXCEPTION(TransformParams(JSON(R"({"arg1": 1, "arg2": 2, "opt1": 10, "options":{"opt1": 10}})"), arg_names), UniValue,
                          HasJSON(R"({"code":-8,"message":"Parameter options conflicts with parameter opt1"})"));

    // Make sure options object specified through args array conflicts.
    BOOST_CHECK_EXCEPTION(TransformParams(JSON(R"({"args": [1, 2, {"opt1": 10}], "opt2": 20})"), arg_names), UniValue,
                          HasJSON(R"({"code":-8,"message":"Parameter options specified twice both as positional and named argument"})"));
}